

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O2

UBool __thiscall icu_63::UVector::equals(UVector *this,UVector *other)

{
  UElement *pUVar1;
  UElement *pUVar2;
  uint uVar3;
  UBool UVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  uVar3 = this->count;
  if (uVar3 != other->count) {
    return '\0';
  }
  if (this->comparer == (UElementsAreEqual *)0x0) {
    uVar6 = 0;
    uVar5 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar5 = uVar6;
    }
    do {
      if (uVar5 == uVar6) {
        return '\x01';
      }
      pUVar1 = this->elements + uVar6;
      pUVar2 = other->elements + uVar6;
      uVar6 = uVar6 + 1;
    } while (pUVar1->pointer == pUVar2->pointer);
  }
  else {
    lVar8 = 0;
    lVar7 = 0;
    do {
      if (this->count <= lVar7) {
        return '\x01';
      }
      UVar4 = (*this->comparer)((void *)((long)other->elements + lVar8),
                                *(UElement *)((long)this->elements + lVar8));
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 8;
    } while (UVar4 != '\0');
  }
  return '\0';
}

Assistant:

UBool   UVector::equals(const UVector &other) const {
    int      i;

    if (this->count != other.count) {
        return FALSE;
    }
    if (comparer == 0) {
        for (i=0; i<count; i++) {
            if (elements[i].pointer != other.elements[i].pointer) {
                return FALSE;
            }
        }
    } else {
        UElement key;
        for (i=0; i<count; i++) {
            key.pointer = &other.elements[i];
            if (!(*comparer)(key, elements[i])) {
                return FALSE;
            }
        }
    }
    return TRUE;
}